

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O1

Interval * __thiscall
tcu::FloatFormat::clampValue(Interval *__return_storage_ptr__,FloatFormat *this,double d)

{
  bool bVar1;
  YesNoMaybe choice;
  double dVar2;
  double dVar3;
  int rExp;
  Interval local_60;
  Interval local_48;
  int local_2c;
  double local_28;
  
  dVar2 = d;
  if (!NAN(d)) {
    dVar2 = (double)(int)((uint)(0.0 < d) - (uint)(d < 0.0));
  }
  local_2c = 0;
  local_28 = d;
  deFractExp(d,&local_2c);
  if (local_2c < this->m_minExp) {
    dVar2 = dVar2 * 0.0;
    local_60.m_hasNaN = NAN(dVar2);
    choice = this->m_hasSubnormal;
    local_60.m_lo = INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_lo = dVar2;
    }
    local_60.m_hi = -INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_hi = dVar2;
    }
    local_48.m_hasNaN = NAN(local_28);
    local_48.m_hi = -INFINITY;
    local_48.m_lo = INFINITY;
    if (!local_48.m_hasNaN) {
      local_48.m_hi = local_28;
      local_48.m_lo = local_28;
    }
  }
  else {
    if ((local_28 < -1.79769313486232e+308 == 1.79769313486232e+308 < local_28) &&
       (local_2c <= this->m_maxExp)) {
      bVar1 = NAN(local_28);
      __return_storage_ptr__->m_hasNaN = bVar1;
      dVar2 = local_28;
      if (bVar1) {
        dVar2 = INFINITY;
      }
      __return_storage_ptr__->m_lo = dVar2;
      if (bVar1) {
        local_28 = -INFINITY;
      }
      __return_storage_ptr__->m_hi = local_28;
      return __return_storage_ptr__;
    }
    dVar3 = this->m_maxValue * dVar2;
    local_60.m_hasNaN = NAN(dVar3);
    choice = this->m_hasInf;
    local_60.m_lo = INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_lo = dVar3;
    }
    local_60.m_hi = -INFINITY;
    if (!local_60.m_hasNaN) {
      local_60.m_hi = dVar3;
    }
    dVar2 = dVar2 * INFINITY;
    local_48.m_hasNaN = NAN(dVar2);
    local_48.m_hi = -INFINITY;
    local_48.m_lo = INFINITY;
    if (!local_48.m_hasNaN) {
      local_48.m_hi = dVar2;
      local_48.m_lo = dVar2;
    }
  }
  anon_unknown_4::chooseInterval(__return_storage_ptr__,choice,&local_60,&local_48);
  return __return_storage_ptr__;
}

Assistant:

Interval FloatFormat::clampValue (double d) const
{
	const double	rSign		= deSign(d);
	int				rExp		= 0;

	DE_ASSERT(!deIsNaN(d));

	deFractExp(d, &rExp);
	if (rExp < m_minExp)
		return chooseInterval(m_hasSubnormal, rSign * 0.0, d);
	else if (deIsInf(d) || rExp > m_maxExp)
		return chooseInterval(m_hasInf, rSign * getMaxValue(), rSign * TCU_INFINITY);

	return Interval(d);
}